

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRotationZ.hpp
# Opt level: O3

void __thiscall
qclab::qgates::CRotationZ<std::complex<float>_>::CRotationZ(CRotationZ<std::complex<float>_> *this)

{
  QRotationGate1<std::complex<float>_> *this_00;
  
  (this->super_QControlledGate2<std::complex<float>_>).control_ = 0;
  (this->super_QControlledGate2<std::complex<float>_>).controlState_ = 1;
  (this->super_QControlledGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
  super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_004eefc0;
  this_00 = (QRotationGate1<std::complex<float>_> *)operator_new(0x18);
  QRotationGate1<std::complex<float>_>::QRotationGate1(this_00,1,0.0,false);
  (this_00->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_> =
       (QObject<std::complex<float>_>)&PTR_nbQubits_004eb9a0;
  (this->gate_)._M_t.
  super___uniq_ptr_impl<qclab::qgates::RotationZ<std::complex<float>_>,_std::default_delete<qclab::qgates::RotationZ<std::complex<float>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_qclab::qgates::RotationZ<std::complex<float>_>_*,_std::default_delete<qclab::qgates::RotationZ<std::complex<float>_>_>_>
  .super__Head_base<0UL,_qclab::qgates::RotationZ<std::complex<float>_>_*,_false>._M_head_impl =
       (RotationZ<std::complex<float>_> *)this_00;
  return;
}

Assistant:

CRotationZ()
        : QControlledGate2< T >( 0 )
        , gate_( std::make_unique< RotationZ< T > >( 1 , 0. ) )
        { }